

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O0

uint32_t c_v128_movemask_8(c_v128 a)

{
  c_v128 a_local;
  
  a_local.u8[0xf] = a.u8[0xf];
  a_local.u8[0xe] = a.u8[0xe];
  a_local.u8[0xd] = a.u8[0xd];
  a_local.u8[0xc] = a.u8[0xc];
  a_local.u8[0xb] = a.u8[0xb];
  a_local.u8[10] = a.u8[10];
  a_local.u8[9] = a.u8[9];
  a_local.u8[8] = a.u8[8];
  a_local.u8[7] = a.u8[7];
  a_local.u8[6] = a.u8[6];
  a_local.u8[5] = a.u8[5];
  a_local.u8[4] = a.u8[4];
  a_local.u8[3] = a.u8[3];
  a_local.u8[2] = a.u8[2];
  a_local.u8[1] = a.u8[1];
  a_local.u8[0] = a.u8[0];
  return (uint)(a_local.s8[0xf] < '\0') << 0xf | (uint)(a_local.s8[0xe] < '\0') << 0xe |
         (uint)(a_local.s8[0xd] < '\0') << 0xd | (uint)(a_local.s8[0xc] < '\0') << 0xc |
         (uint)(a_local.s8[0xb] < '\0') << 0xb | (uint)(a_local.s8[10] < '\0') << 10 |
         (uint)(a_local.s8[9] < '\0') << 9 | (uint)(a_local.s8[8] < '\0') << 8 |
         (uint)(a_local.s8[7] < '\0') << 7 | (uint)(a_local.s8[6] < '\0') << 6 |
         (uint)(a_local.s8[5] < '\0') << 5 | (uint)(a_local.s8[4] < '\0') << 4 |
         (uint)(a_local.s8[3] < '\0') << 3 | (uint)(a_local.s8[2] < '\0') << 2 |
         (uint)(a_local.s8[1] < '\0') << 1 | (uint)(a_local.s8[0] < '\0');
}

Assistant:

SIMD_INLINE uint32_t c_v128_movemask_8(c_v128 a) {
  return ((a.s8[15] < 0) << 15) | ((a.s8[14] < 0) << 14) |
         ((a.s8[13] < 0) << 13) | ((a.s8[12] < 0) << 12) |
         ((a.s8[11] < 0) << 11) | ((a.s8[10] < 0) << 10) |
         ((a.s8[9] < 0) << 9) | ((a.s8[8] < 0) << 8) | ((a.s8[7] < 0) << 7) |
         ((a.s8[6] < 0) << 6) | ((a.s8[5] < 0) << 5) | ((a.s8[4] < 0) << 4) |
         ((a.s8[3] < 0) << 3) | ((a.s8[2] < 0) << 2) | ((a.s8[1] < 0) << 1) |
         ((a.s8[0] < 0) << 0);
}